

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# treemodel.cpp
# Opt level: O2

UModelIndex * __thiscall
TreeModel::parent(UModelIndex *__return_storage_ptr__,TreeModel *this,UModelIndex *index)

{
  TreeItem *this_00;
  bool bVar1;
  int iVar2;
  
  bVar1 = UModelIndex::isValid(index);
  if (bVar1) {
    if ((this->rootItem != (TreeItem *)index->i) &&
       (this_00 = ((TreeItem *)index->i)->parentItem, this_00 != this->rootItem)) {
      iVar2 = TreeItem::row(this_00);
      __return_storage_ptr__->r = iVar2;
      __return_storage_ptr__->c = 0;
      __return_storage_ptr__->i = (uint64_t)this_00;
      __return_storage_ptr__->m = this;
      return __return_storage_ptr__;
    }
  }
  __return_storage_ptr__->r = -1;
  __return_storage_ptr__->c = -1;
  __return_storage_ptr__->i = 0;
  __return_storage_ptr__->m = (TreeModel *)0x0;
  return __return_storage_ptr__;
}

Assistant:

UModelIndex TreeModel::parent(const UModelIndex &index) const
{
    if (!index.isValid())
        return UModelIndex();
    
    TreeItem *childItem = static_cast<TreeItem*>(index.internalPointer());
    if (childItem == rootItem)
        return UModelIndex();
    
    TreeItem *parentItem = childItem->parent();
    
    if (parentItem == rootItem)
        return UModelIndex();
    
    return createIndex(parentItem->row(), 0, parentItem);
}